

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O0

void __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
UnPop<UnifiedRegex::RewindLoopSetWithFollowFirstCont>
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  VariableElement *this_00;
  undefined4 *puVar4;
  SameOrDerivedFrom<UnifiedRegex::RewindLoopSetWithFollowFirstCont,_UnifiedRegex::Cont> local_11;
  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *local_10;
  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this_local;
  
  local_10 = this;
  TemplateParameter::
  SameOrDerivedFrom<UnifiedRegex::RewindLoopSetWithFollowFirstCont,_UnifiedRegex::Cont>::
  SameOrDerivedFrom(&local_11);
  sVar3 = VariableElement::Size<UnifiedRegex::RewindLoopSetWithFollowFirstCont>();
  ContinuousPageStack<1UL>::UnPop(&this->super_ContinuousPageStack<1UL>,sVar3);
  sVar3 = VariableElement::Size<UnifiedRegex::RewindLoopSetWithFollowFirstCont>();
  this_00 = (VariableElement *)
            ContinuousPageStack<1UL>::Top(&this->super_ContinuousPageStack<1UL>,sVar3);
  sVar3 = VariableElement::PreviousElementSize(this_00);
  if (sVar3 != this->topElementSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x207,
                       "(reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template Size<ActualT>()))->PreviousElementSize() == topElementSize)"
                       ,
                       "reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template Size<ActualT>()))->PreviousElementSize() == topElementSize"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  sVar3 = VariableElement::Size<UnifiedRegex::RewindLoopSetWithFollowFirstCont>();
  this->topElementSize = sVar3;
  return;
}

Assistant:

inline void ContinuousPageStackOfVariableElements<T, InitialPageCount>::UnPop()
{
    TemplateParameter::SameOrDerivedFrom<ActualT, T>(); // ActualT must be the same type as, or a type derived from, T
    ContinuousPageStack<InitialPageCount>::UnPop(VariableElement::template
    Size<ActualT>());
    Assert(reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Top(VariableElement::template
    Size<ActualT>()))->PreviousElementSize() == topElementSize);
    topElementSize = VariableElement::template Size<ActualT>();
}